

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

void Abc_TtStoreLoadSaveBin(char *pFileName)

{
  int iVar1;
  uint n;
  int iVar2;
  int iVar3;
  uint *p;
  char *__s;
  char *__filename;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar4;
  size_t sVar5;
  int nInts;
  int nVars;
  int Len;
  int nVarsAll;
  int Value;
  int i;
  FILE *pFileO;
  FILE *pFileI;
  char *pFileOutput;
  char *pFileInput;
  char *pBuffer;
  uint *pTruth;
  char *pFileName_local;
  
  p = (uint *)calloc(0x800,4);
  __s = (char *)calloc(0x10000,1);
  __filename = Extra_FileNameGenericAppend(pFileName,"_binary.data");
  __stream = fopen(pFileName,"rb");
  __stream_00 = fopen(__filename,"wb");
  nVars = -1;
  if (__stream != (FILE *)0x0) {
    while (pcVar4 = fgets(__s,0x10000,__stream), pcVar4 != (char *)0x0) {
      sVar5 = strlen(__s);
      n = (int)sVar5 - 1;
      iVar2 = Abc_Base2Log(n);
      iVar3 = Abc_BitWordNum(n);
      if (n != 1 << ((byte)iVar2 & 0x1f)) {
        __assert_fail("Len == (1 << nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                      ,0x1e8,"void Abc_TtStoreLoadSaveBin(char *)");
      }
      iVar1 = iVar2;
      if ((nVars != -1) && (iVar1 = nVars, nVars != iVar2)) {
        __assert_fail("nVarsAll == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                      ,0x1ec,"void Abc_TtStoreLoadSaveBin(char *)");
      }
      nVars = iVar1;
      memset(p,0,(long)iVar3 << 2);
      for (nVarsAll = 0; nVarsAll < (int)n; nVarsAll = nVarsAll + 1) {
        if (__s[nVarsAll] == '1') {
          Abc_InfoSetBit(p,nVarsAll);
        }
        else if (__s[nVarsAll] != '0') {
          __assert_fail("pBuffer[i] == \'0\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                        ,0x1f2,"void Abc_TtStoreLoadSaveBin(char *)");
        }
      }
      sVar5 = fwrite(p,1,(long)iVar3 << 2,__stream_00);
      if ((int)sVar5 != iVar3 << 2) {
        __assert_fail("Value == (int)sizeof(int) * nInts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                      ,500,"void Abc_TtStoreLoadSaveBin(char *)");
      }
    }
    if (p != (uint *)0x0) {
      free(p);
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
    fclose(__stream);
    fclose(__stream_00);
    printf("Input file \"%s\" was copied into output file \"%s\".\n",pFileName,__filename);
  }
  return;
}

Assistant:

void Abc_TtStoreLoadSaveBin( char * pFileName )
{ 
    unsigned * pTruth = ABC_CALLOC( unsigned, (1 << 11) );
    char * pBuffer = ABC_CALLOC( char, (1 << 16) );
    char * pFileInput  = pFileName;
    char * pFileOutput = Extra_FileNameGenericAppend(pFileName, "_binary.data");
    FILE * pFileI = fopen( pFileInput,  "rb" );
    FILE * pFileO = fopen( pFileOutput, "wb" );
    int i, Value, nVarsAll = -1;
    if ( pFileI == NULL )
        return;
    while ( fgets(pBuffer, (1 << 16), pFileI) )
    {
        int Len   = strlen(pBuffer)-1; // subtract 1 for end-of-line
        int nVars = Abc_Base2Log(Len);
        int nInts = Abc_BitWordNum(Len);
        assert( Len == (1 << nVars) );
        if ( nVarsAll == -1 )
            nVarsAll = nVars;
        else
            assert( nVarsAll == nVars );
        memset( pTruth, 0, sizeof(int)*nInts );
        for ( i = 0; i < Len; i++ )
            if ( pBuffer[i] == '1' )
                Abc_InfoSetBit( pTruth, i );
            else
                assert( pBuffer[i] == '0' );
        Value = fwrite( pTruth, 1, sizeof(int) * nInts, pFileO );
        assert( Value == (int)sizeof(int) * nInts );
    }
    ABC_FREE( pTruth );
    ABC_FREE( pBuffer );
    fclose( pFileI );
    fclose( pFileO );
    printf( "Input file \"%s\" was copied into output file \"%s\".\n", pFileInput, pFileOutput );
}